

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O3

void __thiscall Instruction::~Instruction(Instruction *this)

{
  pointer pcVar1;
  
  this->_vptr_Instruction = (_func_int **)&PTR__Instruction_0012a7f0;
  pcVar1 = (this->m_text)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == &(this->m_text).field_2) {
    return;
  }
  operator_delete(pcVar1);
  return;
}

Assistant:

Instruction::~Instruction() {
}